

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerNewScGenFunc(Lowerer *this,Instr *newScFuncInstr)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  IntConstOpnd *functionBodySlotOpnd;
  undefined4 *puVar4;
  RegOpnd *envOpnd;
  Instr *pIVar5;
  
  functionBodySlotOpnd = (IntConstOpnd *)IR::Instr::UnlinkSrc1(newScFuncInstr);
  OVar2 = IR::Opnd::GetKind((Opnd *)functionBodySlotOpnd);
  if (OVar2 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) goto LAB_005a33fb;
    *puVar4 = 0;
  }
  envOpnd = (RegOpnd *)IR::Instr::UnlinkSrc2(newScFuncInstr);
  OVar2 = IR::Opnd::GetKind((Opnd *)envOpnd);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) {
LAB_005a33fb:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pIVar5 = LoadFunctionBodyAsArgument(this,newScFuncInstr,functionBodySlotOpnd,envOpnd);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,newScFuncInstr,HelperScrFunc_OP_NewScGenFunc,(LabelInstr *)0x0,
             (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return pIVar5;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScGenFunc(IR::Instr * newScFuncInstr)
{
    IR::IntConstOpnd * functionBodySlotOpnd = newScFuncInstr->UnlinkSrc1()->AsIntConstOpnd();
    IR::RegOpnd * envOpnd = newScFuncInstr->UnlinkSrc2()->AsRegOpnd();

    IR::Instr * instrPrev = this->LoadFunctionBodyAsArgument(newScFuncInstr, functionBodySlotOpnd, envOpnd);
    m_lowererMD.ChangeToHelperCall(newScFuncInstr, IR::HelperScrFunc_OP_NewScGenFunc );

    return instrPrev;
}